

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O1

void __thiscall
Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::
AssertCheckHeapBlockNotInAnyList
          (HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *this,
          SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *heapBlock)

{
  SmallHeapBlockT<SmallAllocationBlockAttributes> *pSVar1;
  code *pcVar2;
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *pSVar3;
  undefined4 *puVar4;
  bool bVar5;
  
  pSVar3 = this->heapBlockList;
  bVar5 = pSVar3 != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
  if (pSVar3 != heapBlock && bVar5) {
    do {
      pSVar1 = (pSVar3->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).next;
      if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
        pSVar3 = (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      }
      else {
        pSVar3 = HeapBlock::AsNormalBlock<SmallAllocationBlockAttributes>(&pSVar1->super_HeapBlock);
      }
      bVar5 = pSVar3 != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    } while ((pSVar3 != heapBlock) &&
            (pSVar3 != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0));
  }
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x19e,"(!HeapBlockList::Contains(heapBlock, heapBlockList))",
                       "The heap block already exists in the heapBlockList.");
    if (!bVar5) goto LAB_006c7ec8;
    *puVar4 = 0;
  }
  pSVar3 = this->fullBlockList;
  bVar5 = pSVar3 != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
  if (pSVar3 != heapBlock && bVar5) {
    do {
      pSVar1 = (pSVar3->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).next;
      if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
        pSVar3 = (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      }
      else {
        pSVar3 = HeapBlock::AsNormalBlock<SmallAllocationBlockAttributes>(&pSVar1->super_HeapBlock);
      }
      bVar5 = pSVar3 != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    } while ((pSVar3 != heapBlock) &&
            (pSVar3 != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0));
  }
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x19f,"(!HeapBlockList::Contains(heapBlock, fullBlockList))",
                       "The heap block already exists in the fullBlockList.");
    if (!bVar5) goto LAB_006c7ec8;
    *puVar4 = 0;
  }
  pSVar3 = this->emptyBlockList;
  bVar5 = pSVar3 != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
  if (pSVar3 != heapBlock && bVar5) {
    do {
      pSVar1 = (pSVar3->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).next;
      if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
        pSVar3 = (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      }
      else {
        pSVar3 = HeapBlock::AsNormalBlock<SmallAllocationBlockAttributes>(&pSVar1->super_HeapBlock);
      }
      bVar5 = pSVar3 != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    } while ((pSVar3 != heapBlock) &&
            (pSVar3 != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0));
  }
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x1a0,"(!HeapBlockList::Contains(heapBlock, emptyBlockList))",
                       "The heap block already exists in the emptyBlockList.");
    if (!bVar5) {
LAB_006c7ec8:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::AssertCheckHeapBlockNotInAnyList(TBlockType * heapBlock)
{
#if DBG
    AssertMsg(!HeapBlockList::Contains(heapBlock, heapBlockList), "The heap block already exists in the heapBlockList.");
    AssertMsg(!HeapBlockList::Contains(heapBlock, fullBlockList), "The heap block already exists in the fullBlockList.");
    AssertMsg(!HeapBlockList::Contains(heapBlock, emptyBlockList), "The heap block already exists in the emptyBlockList.");
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    AssertMsg(!HeapBlockList::Contains(heapBlock, sweepableHeapBlockList), "The heap block already exists in the sweepableHeapBlockList.");
#endif
#endif
}